

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O3

Option<Kernel::PolyNf> * __thiscall
Inferences::PolynomialEvaluation::evaluate
          (Option<Kernel::PolyNf> *__return_storage_ptr__,PolynomialEvaluation *this,
          PolyNf *normalized)

{
  char *pcVar1;
  PolyNf **ppPVar2;
  uint uVar3;
  undefined4 uVar4;
  FuncTerm *this_00;
  PolyNf *pPVar5;
  undefined8 uVar6;
  ulong uVar7;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
  *pDVar8;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  *pDVar9;
  undefined2 uVar10;
  char cVar11;
  undefined5 uVar12;
  Self SVar13;
  Self SVar14;
  OptionBase<Kernel::PolyNf> *this_01;
  MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf> *this_02;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>
  RVar15;
  bool bVar16;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict6
  RVar17;
  int iVar18;
  BottomUpChildIter<Kernel::PolyNf> *pBVar19;
  long lVar20;
  PolyNf *pPVar21;
  PolyNf *pPVar22;
  Entry *pEVar23;
  byte bVar24;
  uint uVar25;
  Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  *this_03;
  Entry *pEVar26;
  Entry *this_04;
  MaybeUninit<Kernel::PolyNf> *pMVar27;
  BottomUpChildIter<Kernel::PolyNf> **ppBVar28;
  anon_class_16_2_d708292f f;
  anon_class_16_2_d708292f f_00;
  anon_class_16_2_d708292f f_01;
  anon_class_16_2_20c48a23 f_02;
  anon_class_16_2_d708292f f_03;
  anon_class_16_2_20c48a23 f_04;
  anon_class_16_2_d708292f f_05;
  Option<Kernel::PolyNf> cached;
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  recState;
  Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> recResults;
  PolyNf t;
  PolyNf *argLst;
  uint local_228;
  char local_224;
  uint local_220;
  char local_21c;
  PolyNf local_218;
  undefined5 uStack_200;
  uint uStack_1fb;
  undefined3 uStack_1f7;
  anon_class_1_0_00000001 local_1e9;
  PolyNf local_1e8;
  Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  local_1d0;
  tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
  local_1b8;
  char local_198;
  undefined7 uStack_197;
  char local_190;
  char local_188;
  undefined7 uStack_187;
  undefined1 local_180;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict21
  local_178;
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_148;
  Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_138;
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  local_128;
  uint uStack_127;
  char cStack_123;
  undefined2 uStack_122;
  undefined1 uStack_120;
  int iStack_11f;
  undefined4 uStack_11b;
  uint uStack_117;
  undefined3 uStack_113;
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  local_108;
  uint uStack_107;
  undefined1 uStack_103;
  undefined2 uStack_102;
  undefined1 uStack_100;
  int iStack_ff;
  undefined4 uStack_fb;
  uint uStack_f7;
  undefined3 uStack_f3;
  PolyNf *local_f0;
  OptionBase<Kernel::PolyNf> *local_e8;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict20
  local_e0;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict21
  local_c8;
  anon_class_24_3_9e03d13b local_a0;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict20
  local_88;
  PolyNf *local_70;
  anon_class_24_3_9e03d13b local_68;
  BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PolynomialEvaluation_cpp:224:9),_Lib::ReturnNone<Kernel::PolyNf>,_MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>_&,_std::tuple<>_>
  local_48;
  
  if ((evaluate(Kernel::PolyNf)::memo == '\0') &&
     (iVar18 = __cxa_guard_acquire(&evaluate(Kernel::PolyNf)::memo), iVar18 != 0)) {
    evaluate::memo._memo._capacity = 0;
    evaluate::memo._memo._noOfEntries = 0;
    evaluate::memo._memo._entries = (Entry *)0x0;
    Lib::Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::DefaultHash>::expand(&evaluate::memo._memo);
    __cxa_atexit(MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>::~MemoNonVars,&evaluate::memo,
                 &__dso_handle);
    __cxa_guard_release(&evaluate(Kernel::PolyNf)::memo);
  }
  local_48._memo = &evaluate::memo;
  Lib::
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_148);
  Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&local_138);
  SVar13._M_t.
  super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
  .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>._M_head_impl
       = (__uniq_ptr_data<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>,_true,_true>
            )local_148._self;
  uStack_103 = 0;
  iStack_ff = 0;
  uStack_fb = 0;
  uStack_f7 = 0;
  uStack_f3 = 0;
  local_108 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
               )(*(byte *)&(normalized->super_PolyNfSuper)._inner.
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           .
                           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                & 3);
  if (local_108 ==
      (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
       )0x0) {
    uStack_107 = *(uint *)(normalized->super_PolyNfSuper)._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          .
                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                          ._content;
    uVar6 = *(undefined8 *)
             ((normalized->super_PolyNfSuper)._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content + 8);
    iStack_ff = (int)uVar6;
    uStack_fb = (undefined4)((ulong)uVar6 >> 0x20);
  }
  else if (local_108 ==
           (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
            )0x1) {
    uStack_107 = *(uint *)(normalized->super_PolyNfSuper)._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          .
                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                          ._content;
  }
  else {
    uVar6 = *(undefined8 *)
             ((normalized->super_PolyNfSuper)._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content + 9);
    uStack_107 = *(uint *)(normalized->super_PolyNfSuper)._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          .
                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                          ._content & 0xffffff03;
    uStack_103 = (undefined1)
                 ((uint)*(undefined4 *)
                         ((normalized->super_PolyNfSuper)._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          .
                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                          ._content + 1) >> 0x18);
    iStack_ff._1_3_ = (uint3)uVar6;
    iStack_ff = (uint)iStack_ff._1_3_ << 8;
    uStack_fb = (undefined4)((ulong)uVar6 >> 0x18);
    uStack_f7 = (uint)(byte)((ulong)uVar6 >> 0x38);
  }
  uStack_100 = 0;
  uStack_102 = 0;
  local_c8._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
  .
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  ._0_8_ = &local_e0;
  local_c8._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
  .
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  ._content[7] = (char)&local_1b8;
  local_c8._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
  .
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  ._content[8] = (char)((ulong)&local_1b8 >> 8);
  local_c8._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
  .
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  ._content._9_6_ = SUB86((ulong)&local_1b8 >> 0x10,0);
  local_c8._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
  .
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  ._content[0xf] = (char)(anon_class_1_0_00000001 *)&local_218;
  local_c8._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
  .
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  ._content._16_4_ = SUB84((ulong)&local_218 >> 8,0);
  local_c8._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
  .
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  ._content._20_3_ = SUB83((ulong)&local_218 >> 0x28,0);
  f_02.this = (Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               *)&local_108;
  f_02.fs_ = (tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              *)&local_c8;
  Lib::CoproductImpl::
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  ::
  switchN<Lib::Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>::match<Lib::BottomUpChildIter<Kernel::PolyNf>::BottomUpChildIter(Kernel::PolyNf,std::tuple<>)::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::Variable)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::AnyPoly)_1_>(Lib::BottomUpChildIter<Kernel::PolyNf>::BottomUpChildIter(Kernel::PolyNf,std::tuple<>)::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::Variable)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::AnyPoly)_1_)&::_lambda(auto:1)_1_>
            (&local_178,&local_108,f_02);
  pBVar19 = *(BottomUpChildIter<Kernel::PolyNf> **)
             ((long)SVar13._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                    ._M_head_impl + 0x10);
  if (pBVar19 ==
      *(BottomUpChildIter<Kernel::PolyNf> **)
       ((long)SVar13._M_t.
              super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
              .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
              _M_head_impl + 0x18)) {
    Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::expand
              ((Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)
               SVar13._M_t.
               super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
               .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
               _M_head_impl);
    pBVar19 = *(BottomUpChildIter<Kernel::PolyNf> **)
               ((long)SVar13._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                      .
                      super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                      ._M_head_impl + 0x10);
  }
  pDVar8 = &(pBVar19->_self)._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
  ;
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0xf] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x10] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x11] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x12] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x13] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x14] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x15] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x16] = '\0';
  pDVar8 = &(pBVar19->_self)._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
  ;
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x17] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x18] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x19] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x1a] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x1b] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x1c] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x1d] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0x1e] = '\0';
  *(undefined8 *)
   &(pBVar19->_self)._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
       = 0;
  pDVar8 = &(pBVar19->_self)._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
  ;
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[7] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[8] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[9] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[10] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0xb] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0xc] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0xd] = '\0';
  (pDVar8->
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  )._content[0xe] = '\0';
  *(undefined4 *)
   ((pBVar19->_self)._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content + 0x1f) = 0;
  local_178._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
  .
  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
  ._0_1_ = local_178._inner.
           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
           .
           super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
           ._0_1_ & 3;
  *(undefined1 *)
   &(pBVar19->_self)._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
       = local_178._inner.
         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
         .
         super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
         ._0_1_;
  if (local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._0_1_ == 0) {
    *(undefined4 *)
     (pBVar19->_self)._inner.
     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
     .
     super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
     ._content = local_178._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                 .
                 super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                 ._content._0_4_;
    *(ulong *)((pBVar19->_self)._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
               .
               super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
               ._content + 8) =
         CONCAT44(local_178._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                  .
                  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                  ._content._12_4_,
                  local_178._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                  .
                  super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                  ._content._8_4_);
    *(undefined4 *)
     ((pBVar19->_self)._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content + 0x10) =
         local_178._inner.
         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
         .
         super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
         ._content._16_4_;
  }
  else {
    pcVar1 = (pBVar19->_self)._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
             .
             super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
             ._content;
    if (local_178._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
        .
        super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
        ._0_1_ == 1) {
      *(undefined4 *)pcVar1 =
           local_178._inner.
           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
           .
           super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
           ._content._0_4_;
    }
    else {
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pDVar8 = &(pBVar19->_self)._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      ;
      (pDVar8->
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      )._content[8] = '\0';
      (pDVar8->
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      )._content[9] = '\0';
      (pDVar8->
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      )._content[10] = '\0';
      (pDVar8->
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      )._content[0xb] = '\0';
      (pDVar8->
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      )._content[0xc] = '\0';
      (pDVar8->
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      )._content[0xd] = '\0';
      (pDVar8->
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      )._content[0xe] = '\0';
      (pDVar8->
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      )._content[0xf] = '\0';
      pDVar8 = &(pBVar19->_self)._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      ;
      (pDVar8->
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      )._content[0x10] = '\0';
      (pDVar8->
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      )._content[0x11] = '\0';
      (pDVar8->
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      )._content[0x12] = '\0';
      (pDVar8->
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      )._content[0x13] = '\0';
      (pBVar19->_self)._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content[0] = local_178._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                     .
                     super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                     ._content[0] & 3;
      *(uint *)((pBVar19->_self)._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                .
                super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                ._content + 1) =
           CONCAT13(local_178._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                    .
                    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    ._content[4],
                    local_178._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                    .
                    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    ._content._1_3_);
      *(ulong *)((pBVar19->_self)._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                 .
                 super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                 ._content + 9) =
           CONCAT17(local_178._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                    .
                    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    ._content[0x10],
                    CONCAT43(local_178._inner.
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                             .
                             super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                             ._content._12_4_,
                             local_178._inner.
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                             .
                             super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                             ._content._9_3_));
      *(ulong *)((pBVar19->_self)._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                 .
                 super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                 ._content + 0x14) =
           CONCAT53(local_178._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                    .
                    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    ._content._23_5_,
                    local_178._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                    .
                    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    ._content._20_3_);
      *(undefined4 *)
       ((pBVar19->_self)._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
        .
        super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
        ._content + 0x1c) =
           local_178._inner.
           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
           .
           super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
           ._content._28_4_;
    }
  }
  *(BottomUpChildIter<Kernel::PolyNf> **)
   ((long)SVar13._M_t.
          super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
          .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
          _M_head_impl + 0x10) =
       *(BottomUpChildIter<Kernel::PolyNf> **)
        ((long)SVar13._M_t.
               super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
               .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
               _M_head_impl + 0x10) + 1;
  pBVar19 = *(BottomUpChildIter<Kernel::PolyNf> **)
             ((long)local_148._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                    ._M_head_impl + 0x10);
  local_f0 = normalized;
  local_e8 = &__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>;
  if (pBVar19 !=
      *(BottomUpChildIter<Kernel::PolyNf> **)
       ((long)local_148._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
              .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
              _M_head_impl + 8)) {
    do {
      f.this = &pBVar19[-1]._self;
      f.f = (anon_class_1_0_00000001 *)&local_218;
      RVar15 = Lib::CoproductImpl::
               RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
               ::
               switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                         ((RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                           *)&pBVar19[-1]._self,f);
      if (RVar15) {
        this_03 = &(*(BottomUpChildIter<Kernel::PolyNf> **)
                     ((long)local_148._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                            ._M_head_impl + 0x10))[-1]._self;
        f_00.this = this_03;
        f_00.f = (anon_class_1_0_00000001 *)&local_218;
        Lib::CoproductImpl::
        RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
        ::
        switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                  ((RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    *)this_03,f_00);
        f_03.this = this_03;
        f_03.f = (anon_class_1_0_00000001 *)&local_218;
        Lib::CoproductImpl::
        RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
        ::
        switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                  (&local_e0,
                   (RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    *)this_03,f_03);
        MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>::get
                  ((Option<Kernel::PolyNf> *)&local_218,local_48._memo,&local_e0);
        SVar13._M_t.
        super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
        .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
        _M_head_impl = local_148._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                       ._M_head_impl;
        if ((anon_class_1_0_00000001)
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._0_1_ == (anon_class_1_0_00000001)0x1) {
          local_21c = '\0';
          local_180 = 0;
          local_188 = '\0';
          uStack_187 = 0;
          bVar24 = local_218.super_PolyNfSuper._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ._content[3] & 3;
          if (bVar24 == 0) {
            uVar25 = CONCAT13(local_218.super_PolyNfSuper._inner.
                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                              .
                              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                              ._content[7],
                              CONCAT21(local_218.super_PolyNfSuper._inner.
                                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                       .
                                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                       ._content._5_2_,
                                       local_218.super_PolyNfSuper._inner.
                                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                       .
                                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                       ._content[4]));
            local_188 = local_218.super_PolyNfSuper._inner.
                        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                        .
                        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                        ._content[0xc];
            uStack_187 = (undefined7)
                         (CONCAT44(local_218.super_PolyNfSuper._inner.
                                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                   .
                                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                   ._content._16_4_,
                                   CONCAT13(local_218.super_PolyNfSuper._inner.
                                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                            .
                                            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                            ._content[0xf],
                                            CONCAT21(local_218.super_PolyNfSuper._inner.
                                                                                                          
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                                  .
                                                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                                  ._content._13_2_,
                                                  local_218.super_PolyNfSuper._inner.
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                                  .
                                                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                                  ._content[0xc]))) >> 8);
            local_220 = uVar25;
          }
          else if (bVar24 == 1) {
            uVar25 = CONCAT13(local_218.super_PolyNfSuper._inner.
                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                              .
                              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                              ._content[7],
                              CONCAT21(local_218.super_PolyNfSuper._inner.
                                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                       .
                                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                       ._content._5_2_,
                                       local_218.super_PolyNfSuper._inner.
                                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                       .
                                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                       ._content[4]));
            local_220 = uVar25;
          }
          else {
            uVar25 = (uint)(local_218.super_PolyNfSuper._inner.
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                            .
                            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                            ._content[4] & 3);
            uStack_187 = CONCAT43(local_218.super_PolyNfSuper._inner.
                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                  .
                                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                  ._content._16_4_,
                                  CONCAT12(local_218.super_PolyNfSuper._inner.
                                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                           .
                                           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                           ._content[0xf],
                                           local_218.super_PolyNfSuper._inner.
                                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                           .
                                           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                           ._content._13_2_));
            local_220 = CONCAT31(CONCAT12(local_218.super_PolyNfSuper._inner.
                                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                          .
                                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                          ._content[7],
                                          local_218.super_PolyNfSuper._inner.
                                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                          .
                                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                          ._content._5_2_),
                                 local_218.super_PolyNfSuper._inner.
                                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                 .
                                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                 ._content[4]) & 0xffffff03;
            local_21c = local_218.super_PolyNfSuper._inner.
                        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                        .
                        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                        ._content[8];
            local_180 = local_218.super_PolyNfSuper._inner.
                        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                        .
                        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                        ._21_1_;
          }
          ppBVar28 = (BottomUpChildIter<Kernel::PolyNf> **)
                     ((long)local_138._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl
                     + 0x10);
          pBVar19 = *(BottomUpChildIter<Kernel::PolyNf> **)
                     ((long)local_138._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl
                     + 0x10);
          if (pBVar19 ==
              *(BottomUpChildIter<Kernel::PolyNf> **)
               ((long)local_138._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl +
               0x18)) {
            Lib::Stack<Kernel::PolyNf>::expand
                      ((Stack<Kernel::PolyNf> *)
                       local_138._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl);
            pBVar19 = *ppBVar28;
          }
          *(undefined8 *)
           &(pBVar19->_self)._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
            .
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
               = 0;
          pDVar8 = &(pBVar19->_self)._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
          ;
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[7] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[8] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[9] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[10] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0xb] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0xc] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0xd] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0xe] = '\0';
          pDVar8 = &(pBVar19->_self)._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
          ;
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0xf] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x10] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x11] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x12] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x13] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x14] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x15] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x16] = '\0';
          *(byte *)&(pBVar19->_self)._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                    .
                    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
               = bVar24;
          if (bVar24 == 0) {
            *(uint *)(pBVar19->_self)._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                     .
                     super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                     ._content = local_220;
            *(ulong *)((pBVar19->_self)._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                       .
                       super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                       ._content + 8) = CONCAT71(uStack_187,local_188);
          }
          else if (bVar24 == 1) {
            *(uint *)(pBVar19->_self)._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                     .
                     super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                     ._content = local_220;
          }
          else {
            pDVar8 = &(pBVar19->_self)._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
            ;
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[4] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[5] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[6] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[7] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[8] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[9] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[10] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[0xb] = '\0';
            pDVar8 = &(pBVar19->_self)._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
            ;
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[0xc] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[0xd] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[0xe] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[0xf] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[0x10] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[0x11] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[0x12] = '\0';
            (pDVar8->
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            )._content[0x13] = '\0';
            (pBVar19->_self)._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
            .
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            ._content[0] = (byte)uVar25 & 3;
            *(uint *)((pBVar19->_self)._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                      .
                      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                      ._content + 1) = CONCAT13(local_21c,local_220._1_3_);
            *(ulong *)((pBVar19->_self)._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                       .
                       super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                       ._content + 9) = CONCAT17(local_180,uStack_187);
          }
          lVar20 = 0x18;
        }
        else {
          cStack_123 = '\0';
          iStack_11f = 0;
          uStack_11b = 0;
          uStack_117 = 0;
          uStack_113 = 0;
          local_128 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                       )(local_e0.super_PolyNfSuper._inner.
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                         .
                         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                         ._0_1_ & 3);
          if (local_128 ==
              (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
               )0x1) {
            uStack_127._0_1_ =
                 local_e0.super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._content[0];
            uStack_127._1_1_ =
                 local_e0.super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._content[1];
            uStack_127._2_1_ =
                 local_e0.super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._content[2];
            uStack_127._3_1_ =
                 local_e0.super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._content[3];
          }
          else {
            uStack_11b = local_e0.super_PolyNfSuper._inner.
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                         .
                         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                         ._content._12_4_;
            if ((local_e0.super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._0_1_ & 3) == 0) {
              uStack_127._0_1_ =
                   local_e0.super_PolyNfSuper._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ._content[0];
              uStack_127._1_1_ =
                   local_e0.super_PolyNfSuper._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ._content[1];
              uStack_127._2_1_ =
                   local_e0.super_PolyNfSuper._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ._content[2];
              uStack_127._3_1_ =
                   local_e0.super_PolyNfSuper._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ._content[3];
              iStack_11f = (int)CONCAT71(local_e0.super_PolyNfSuper._inner.
                                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                         .
                                         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                         ._content._9_7_,
                                         local_e0.super_PolyNfSuper._inner.
                                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                         .
                                         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                         ._content[8]);
            }
            else {
              uStack_127 = local_e0.super_PolyNfSuper._inner.
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           .
                           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                           ._content._0_4_ & 0xffffff03;
              cStack_123 = local_e0.super_PolyNfSuper._inner.
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           .
                           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                           ._content[4];
              iStack_11f._1_3_ =
                   local_e0.super_PolyNfSuper._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ._content._9_3_;
              iStack_11f = (uint)iStack_11f._1_3_ << 8;
              uStack_117 = (uint)(byte)local_e0.super_PolyNfSuper._inner.
                                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                       .
                                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                       ._content[0x10];
            }
          }
          uStack_120 = 0;
          uStack_122 = 0;
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
          ._M_head_impl._0_1_ = SUB81(&local_a0,0);
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
          ._M_head_impl._1_4_ = (uint)((ulong)&local_a0 >> 8);
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
          ._M_head_impl._5_1_ = (char)((ulong)&local_a0 >> 0x28);
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
          ._M_head_impl._6_2_ = (undefined2)((ulong)&local_a0 >> 0x30);
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_false>
          ._M_head_impl._0_1_ = SUB81(&local_1d0,0);
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_false>
          ._M_head_impl._1_4_ = (int)((ulong)&local_1d0 >> 8);
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_false>
          ._M_head_impl._5_3_ = (undefined3)((ulong)&local_1d0 >> 0x28);
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_false>
          ._M_head_impl._0_1_ = SUB81(&local_68,0);
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_false>
          ._M_head_impl._1_4_ = (uint)((ulong)&local_68 >> 8);
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_false>
          ._M_head_impl._5_3_ = (undefined3)((ulong)&local_68 >> 0x28);
          f_04.this = (Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       *)&local_128;
          f_04.fs_ = &local_1b8;
          Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>::match<Lib::BottomUpChildIter<Kernel::PolyNf>::BottomUpChildIter(Kernel::PolyNf,std::tuple<>)::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::Variable)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::AnyPoly)_1_>(Lib::BottomUpChildIter<Kernel::PolyNf>::BottomUpChildIter(Kernel::PolyNf,std::tuple<>)::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::Variable)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::AnyPoly)_1_)&::_lambda(auto:1)_1_>
                    (&local_c8,&local_128,f_04);
          ppBVar28 = (BottomUpChildIter<Kernel::PolyNf> **)
                     ((long)SVar13._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                            ._M_head_impl + 0x10);
          pBVar19 = *(BottomUpChildIter<Kernel::PolyNf> **)
                     ((long)SVar13._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                            ._M_head_impl + 0x10);
          if (pBVar19 ==
              *(BottomUpChildIter<Kernel::PolyNf> **)
               ((long)SVar13._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                      .
                      super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                      ._M_head_impl + 0x18)) {
            Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::expand
                      ((Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)
                       SVar13._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                       ._M_head_impl);
            pBVar19 = *ppBVar28;
          }
          pDVar8 = &(pBVar19->_self)._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
          ;
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0xf] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x10] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x11] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x12] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x13] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x14] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x15] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x16] = '\0';
          pDVar8 = &(pBVar19->_self)._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
          ;
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x17] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x18] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x19] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x1a] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x1b] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x1c] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x1d] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0x1e] = '\0';
          *(undefined8 *)
           &(pBVar19->_self)._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
            .
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
               = 0;
          pDVar8 = &(pBVar19->_self)._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
          ;
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[7] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[8] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[9] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[10] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0xb] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0xc] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0xd] = '\0';
          (pDVar8->
          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
          )._content[0xe] = '\0';
          *(undefined4 *)
           ((pBVar19->_self)._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
            .
            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            ._content + 0x1f) = 0;
          *(byte *)&(pBVar19->_self)._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                    .
                    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
               = local_c8._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                 .
                 super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                 ._0_1_ & 3;
          if ((local_c8._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
               .
               super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
               ._0_8_ & 3) == 0) {
            *(undefined4 *)
             (pBVar19->_self)._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
             .
             super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
             ._content = local_c8._inner.
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                         .
                         super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                         ._content._0_4_;
            *(ulong *)((pBVar19->_self)._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                       .
                       super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                       ._content + 8) =
                 CONCAT17(local_c8._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                          .
                          super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                          ._content[0xf],
                          CONCAT61(local_c8._inner.
                                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                                   .
                                   super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                                   ._content._9_6_,
                                   local_c8._inner.
                                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                                   .
                                   super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                                   ._content[8]));
            *(undefined4 *)
             ((pBVar19->_self)._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
              .
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              ._content + 0x10) =
                 local_c8._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                 .
                 super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                 ._content._16_4_;
          }
          else {
            pcVar1 = (pBVar19->_self)._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                     .
                     super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                     ._content;
            if ((local_c8._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                 .
                 super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                 ._0_1_ & 3) == 1) {
              *(undefined4 *)pcVar1 =
                   local_c8._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                   .
                   super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                   ._content._0_4_;
            }
            else {
              pcVar1[0] = '\0';
              pcVar1[1] = '\0';
              pcVar1[2] = '\0';
              pcVar1[3] = '\0';
              pcVar1[4] = '\0';
              pcVar1[5] = '\0';
              pcVar1[6] = '\0';
              pcVar1[7] = '\0';
              pDVar8 = &(pBVar19->_self)._inner.
                        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
              ;
              (pDVar8->
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              )._content[8] = '\0';
              (pDVar8->
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              )._content[9] = '\0';
              (pDVar8->
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              )._content[10] = '\0';
              (pDVar8->
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              )._content[0xb] = '\0';
              (pDVar8->
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              )._content[0xc] = '\0';
              (pDVar8->
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              )._content[0xd] = '\0';
              (pDVar8->
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              )._content[0xe] = '\0';
              (pDVar8->
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              )._content[0xf] = '\0';
              pDVar8 = &(pBVar19->_self)._inner.
                        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
              ;
              (pDVar8->
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              )._content[0x10] = '\0';
              (pDVar8->
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              )._content[0x11] = '\0';
              (pDVar8->
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              )._content[0x12] = '\0';
              (pDVar8->
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              )._content[0x13] = '\0';
              (pBVar19->_self)._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
              .
              super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              ._content[0] = local_c8._inner.
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                             .
                             super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                             ._content[0] & 3;
              *(undefined4 *)
               ((pBVar19->_self)._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                .
                super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                ._content + 1) =
                   local_c8._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                   .
                   super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                   ._content._1_4_;
              *(ulong *)((pBVar19->_self)._inner.
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                         .
                         super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                         ._content + 9) =
                   CONCAT17(local_c8._inner.
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                            .
                            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                            ._content[0x10],
                            CONCAT16(local_c8._inner.
                                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                                     .
                                     super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                                     ._content[0xf],
                                     local_c8._inner.
                                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                                     .
                                     super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                                     ._content._9_6_));
              *(ulong *)((pBVar19->_self)._inner.
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                         .
                         super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                         ._content + 0x14) =
                   CONCAT53(local_c8._inner.
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                            .
                            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                            ._content._23_5_,
                            local_c8._inner.
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                            .
                            super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                            ._content._20_3_);
              *(undefined4 *)
               ((pBVar19->_self)._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                .
                super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                ._content + 0x1c) =
                   local_c8._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                   .
                   super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                   ._content._28_4_;
            }
          }
          lVar20 = 0x24;
        }
        *ppBVar28 = (BottomUpChildIter<Kernel::PolyNf> *)
                    (((*ppBVar28)->_self)._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                     .
                     super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                     ._content + lVar20 + -1);
      }
      else {
        pBVar19 = *(BottomUpChildIter<Kernel::PolyNf> **)
                   ((long)local_148._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                          ._M_head_impl + 0x10);
        *(BottomUpChildIter<Kernel::PolyNf> **)
         ((long)local_148._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                ._M_head_impl + 0x10) = pBVar19 + -1;
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xf] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x10] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x11] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x12] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x13] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._21_1_ = 0;
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._22_2_ = 0;
        uStack_200 = 0;
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[4] = 0;
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[5] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[6] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[7] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[8] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[9] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[10] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xb] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xc] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xd] = '\0';
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xe] = '\0';
        uStack_1fb = 0;
        uStack_1f7 = 0;
        local_218.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._0_1_ = *(byte *)&pBVar19[-1]._self._inner.
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                           .
                           super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                 & 3;
        if ((anon_class_1_0_00000001)
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._0_1_ == (anon_class_1_0_00000001)0x0) {
          uVar4 = *(undefined4 *)
                   pBVar19[-1]._self._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                   .
                   super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                   ._content;
          local_218.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0] = (char)uVar4;
          local_218.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content._1_2_ = SUB42((uint)uVar4 >> 8,0);
          local_218.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[3] = (char)((uint)uVar4 >> 0x18);
          this_00 = *(FuncTerm **)
                     (pBVar19[-1]._self._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                      .
                      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                      ._content + 8);
          local_218.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content._8_4_ = SUB84(this_00,0);
          local_218.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xc] = (char)((ulong)this_00 >> 0x20);
          local_218.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content._13_2_ = SUB82((ulong)this_00 >> 0x28,0);
          local_218.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xf] = (char)((ulong)this_00 >> 0x38);
          local_218.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content._16_4_ =
               *(undefined4 *)
                (pBVar19[-1]._self._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                 .
                 super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                 ._content + 0x10);
          uVar25 = Kernel::FuncTerm::numTermArguments(this_00);
LAB_004f6115:
          SVar14._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl =
               (__uniq_ptr_data<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>,_true,_true>
                )(__uniq_ptr_data<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>,_true,_true>
                  )local_138._self;
          if (uVar25 == 0) goto LAB_004f6158;
          pPVar21 = *(PolyNf **)
                     ((long)local_138._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl
                     + 8);
          pPVar5 = *(PolyNf **)
                    ((long)local_138._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl
                    + 0x10);
          pPVar22 = pPVar21;
          if ((local_218.super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._0_1_ & 3) == 1) {
            uVar25 = 0;
          }
          else {
            uVar25 = uStack_1fb;
            if ((local_218.super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._0_1_ & 3) == 0) {
              uVar25 = Kernel::FuncTerm::numTermArguments
                                 ((FuncTerm *)
                                  CONCAT17(local_218.super_PolyNfSuper._inner.
                                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                           .
                                           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                           ._content[0xf],
                                           CONCAT25(local_218.super_PolyNfSuper._inner.
                                                                                                        
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                                  .
                                                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                                  ._content._13_2_,
                                                  CONCAT14(local_218.super_PolyNfSuper._inner.
                                                                                                                      
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                                  .
                                                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                                  ._content[0xc],
                                                  local_218.super_PolyNfSuper._inner.
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                                  .
                                                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                                  ._content._8_4_))));
              pPVar22 = *(PolyNf **)
                         ((long)SVar14._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>.
                                _M_head_impl + 8);
            }
          }
          local_70 = pPVar22 + (((long)pPVar5 - (long)pPVar21 >> 3) * -0x5555555555555555 -
                               (ulong)uVar25);
        }
        else {
          if ((anon_class_1_0_00000001)
              local_218.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._0_1_ != (anon_class_1_0_00000001)0x1) {
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[5] = '\0';
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[6] = '\0';
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[7] = '\0';
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0] = pBVar19[-1]._self._inner.
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                           .
                           super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                           ._content[0] & 3;
            uVar6 = *(undefined8 *)
                     (pBVar19[-1]._self._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                      .
                      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                      ._content + 9);
            uVar4 = *(undefined4 *)
                     (pBVar19[-1]._self._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                      .
                      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                      ._content + 1);
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content._1_2_ = SUB42(uVar4,0);
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[3] = (char)((uint)uVar4 >> 0x10);
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[4] = (char)((uint)uVar4 >> 0x18);
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content._9_3_ = SUB83(uVar6,0);
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content._8_4_ =
                 (uint)(uint3)local_218.super_PolyNfSuper._inner.
                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                              .
                              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                              ._content._9_3_ << 8;
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0xc] = (char)((ulong)uVar6 >> 0x18);
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content._13_2_ = SUB82((ulong)uVar6 >> 0x20,0);
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0xf] = (char)((ulong)uVar6 >> 0x30);
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0x10] = (char)((ulong)uVar6 >> 0x38);
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content._17_3_ = 0;
            uVar25 = *(uint *)(pBVar19[-1]._self._inner.
                               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                               .
                               super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                               ._content + 0x1c);
            uVar6 = *(undefined8 *)
                     (pBVar19[-1]._self._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                      .
                      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                      ._content + 0x14);
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._21_1_ = SUB81(uVar6,0);
            local_218.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._22_2_ = SUB82((ulong)uVar6 >> 8,0);
            uStack_200 = (undefined5)((ulong)uVar6 >> 0x18);
            uStack_1fb = uVar25;
            goto LAB_004f6115;
          }
          uVar4 = *(undefined4 *)
                   pBVar19[-1]._self._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                   .
                   super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                   ._content;
          local_218.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0] = (char)uVar4;
          local_218.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content._1_2_ = SUB42((uint)uVar4 >> 8,0);
          local_218.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[3] = (char)((uint)uVar4 >> 0x18);
LAB_004f6158:
          local_70 = (PolyNf *)0x0;
        }
        this_02 = local_48._memo;
        f_05.this = (Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                     *)&local_218;
        f_05.f = (anon_class_1_0_00000001 *)&local_1b8;
        Lib::CoproductImpl::
        RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
        ::
        switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                  (&local_88,
                   (RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                    *)&local_218,f_05);
        uVar12 = local_1d0._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._content._11_5_;
        cVar11 = local_1d0._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._content[3];
        uVar10 = local_1d0._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._content._1_2_;
        local_a0.this = &local_48;
        local_a0.argLst = &local_70;
        uVar25 = (byte)local_88.super_PolyNfSuper._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       .
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       ._0_1_ & 3;
        local_1d0._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content._11_5_ =
             local_88.super_PolyNfSuper._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._content._11_5_;
        local_1d0._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[3] = local_88.super_PolyNfSuper._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       .
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       ._content[3];
        local_1d0._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content._1_2_ =
             local_88.super_PolyNfSuper._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._content._1_2_;
        local_a0.orig = (BottomUpChildIter<Kernel::PolyNf> *)&local_218;
        if ((local_88.super_PolyNfSuper._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._0_1_ & 3) == 0) {
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[4] = '\0';
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[5] = '\0';
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[6] = '\0';
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[7] = '\0';
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x10] = 0;
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[8] = local_88.super_PolyNfSuper._inner.
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                         .
                         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                         ._content[8];
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0] = local_88.super_PolyNfSuper._inner.
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                         .
                         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                         ._content[0];
LAB_004f646e:
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x13] = '\0';
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._21_3_ = 0;
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x11] = '\0';
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x12] = '\0';
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content._9_2_ =
               local_88.super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content._9_2_;
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._0_1_ = SUB41(uVar25,0);
          local_68.this = local_a0.this;
          local_68.orig = (BottomUpChildIter<Kernel::PolyNf> *)&local_218;
          local_68.argLst = local_a0.argLst;
          if (*(int *)((long)this_02 + 0x18) <= *(int *)((long)this_02 + 4)) {
            Lib::Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::DefaultHash>::expand(&this_02->_memo);
          }
          f_01.this = &local_1d0;
          f_01.f = &local_1e9;
          RVar17 = Lib::CoproductImpl::
                   RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ::
                   switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                             ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                               *)&local_1d0,f_01);
          uVar25 = uVar25 * 0x40 + RVar17 + 0x9e3779b9 ^ uVar25;
          uVar25 = uVar25 + (uVar25 == 0);
          pEVar23 = *(Entry **)((long)this_02 + 8);
          uVar7 = (ulong)uVar25 % (ulong)*(uint *)&this_02->_memo;
          this_04 = pEVar23 + uVar7;
          uVar3 = pEVar23[uVar7].code;
          while (uVar3 != 0) {
            if (uVar3 == uVar25) {
              bVar16 = Kernel::operator==((PolyNf *)&(this_04->_key).__align,(PolyNf *)&local_1d0);
              if (bVar16) {
                local_1e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._0_1_ = (this_04->_value).__data[0] & 3;
                if (local_1e8.super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._0_1_ == 0) {
                  uVar4 = *(undefined4 *)((long)&this_04->_value + 1);
                  uVar6 = *(undefined8 *)((long)&this_04->_value + 9);
                  *(undefined8 *)((long)&this_04->_value + 0x10) = 0;
                  *(undefined8 *)&this_04->_value = 0;
                  *(undefined8 *)((long)&this_04->_value + 8) = 0;
                  *(undefined4 *)((long)&this_04->_value + 1) = uVar4;
                  *(undefined8 *)((long)&this_04->_value + 9) = uVar6;
                  local_1e8.super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  ._0_1_ = 0;
                  goto LAB_004f6632;
                }
                if (local_1e8.super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._0_1_ == 1) {
                  *(undefined8 *)((long)&this_04->_value + 4) = 0;
                  *(undefined8 *)((long)&this_04->_value + 0xc) = 0;
                  *(undefined4 *)((long)&this_04->_value + 0x14) = 0;
                  *(undefined4 *)((long)&this_04->_value + 1) =
                       *(undefined4 *)((long)&this_04->_value + 1);
                }
                else {
                  *(undefined8 *)((long)&this_04->_value + 5) = 0;
                  *(undefined8 *)((long)&this_04->_value + 0xd) = 0;
                  *(undefined4 *)((long)&this_04->_value + 0x14) = 0;
                  (this_04->_value).__data[1] = (this_04->_value).__data[1] & 3;
                  *(undefined4 *)((long)&this_04->_value + 2) =
                       *(undefined4 *)((long)&this_04->_value + 2);
                  *(undefined8 *)((long)&this_04->_value + 10) =
                       *(undefined8 *)((long)&this_04->_value + 10);
                }
                (this_04->_value).__data[0] =
                     local_1e8.super_PolyNfSuper._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     ._0_1_;
                goto LAB_004f667d;
              }
              pEVar23 = *(Entry **)((long)this_02 + 8);
            }
            pEVar26 = this_04 + 1;
            this_04 = pEVar23;
            if (pEVar26 != *(Entry **)((long)this_02 + 0x10)) {
              this_04 = pEVar26;
            }
            uVar3 = this_04->code;
          }
          *(int *)((long)this_02 + 4) = *(int *)((long)this_02 + 4) + 1;
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
          ._M_head_impl._5_1_ = '\0';
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_false>
          ._M_head_impl._1_4_ = 0;
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          ._13_4_ = 0;
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_false>
          ._M_head_impl._1_4_ = 0;
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_false>
          ._M_head_impl._5_3_ = 0;
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
          ._M_head_impl._0_1_ =
               (anon_class_1_0_00000001)
               (local_1d0._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._0_1_ & 3);
          if (local_1b8.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
              ._M_head_impl._0_1_ == (anon_class_1_0_00000001)0x1) {
            local_1b8.
            super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
            .
            super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
            .
            super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
            .
            super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
            ._M_head_impl._1_4_ =
                 CONCAT13(local_1d0._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          .
                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                          ._content[3],
                          CONCAT21(local_1d0._inner.
                                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                   .
                                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                   ._content._1_2_,
                                   local_1d0._inner.
                                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                   .
                                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                   ._content[0]));
          }
          else {
            local_1b8.
            super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
            ._13_4_ = local_1d0._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      ._content._12_4_;
            if ((local_1d0._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._0_1_ & 3) == 0) {
              local_1b8.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
              ._M_head_impl._1_4_ =
                   CONCAT13(local_1d0._inner.
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                            .
                            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                            ._content[3],
                            CONCAT21(local_1d0._inner.
                                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                     .
                                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                     ._content._1_2_,
                                     local_1d0._inner.
                                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                     .
                                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                     ._content[0]));
              local_1b8.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Head_base<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_false>
              ._M_head_impl._1_4_ =
                   (int)CONCAT53(local_1d0._inner.
                                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                 .
                                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                 ._content._11_5_,
                                 CONCAT21(local_1d0._inner.
                                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                          .
                                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                          ._content._9_2_,
                                          local_1d0._inner.
                                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                          .
                                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                          ._content[8]));
            }
            else {
              local_1b8.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
              ._M_head_impl._1_4_ =
                   CONCAT31(CONCAT12(local_1d0._inner.
                                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                     .
                                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                     ._content[3],
                                     local_1d0._inner.
                                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                     .
                                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                     ._content._1_2_),
                            local_1d0._inner.
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                            .
                            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                            ._content[0]) & 0xffffff03;
              local_1b8.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
              ._M_head_impl._5_1_ =
                   local_1d0._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ._content[4];
              local_1b8.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Head_base<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_false>
              ._M_head_impl._2_3_ =
                   (uint3)CONCAT52(local_1d0._inner.
                                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                   .
                                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                   ._content._11_5_,
                                   local_1d0._inner.
                                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                   .
                                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                   ._content._9_2_);
              local_1b8.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Head_base<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_false>
              ._M_head_impl._1_4_ =
                   (uint)local_1b8.
                         super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
                         .
                         super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
                         .
                         super__Head_base<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_false>
                         ._M_head_impl._2_3_ << 8;
              local_1b8.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
              .
              super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_false>
              ._M_head_impl._1_4_ =
                   (uint)(byte)local_1d0._inner.
                               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                               .
                               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                               ._content[0x10];
            }
          }
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_false>
          ._M_head_impl._0_1_ = 0;
          local_1b8.
          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:597:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:598:9)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&>
          .
          super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_BottomUpEvaluation_hpp:599:9)_&,_false>
          ._M_head_impl._6_2_ = 0;
          Lib::
          BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/PolynomialEvaluation.cpp:224:9),_Lib::ReturnNone<Kernel::PolyNf>,_MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>_&,_std::tuple<>_>
          ::apply::anon_class_24_3_9e03d13b::operator()(&local_e0,&local_68);
          Lib::Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::DefaultHash>::Entry::init
                    (this_04,(EVP_PKEY_CTX *)&local_1b8);
          local_1e8.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._0_1_ = (this_04->_value).__data[0] & 3;
          if (local_1e8.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._0_1_ == 0) {
LAB_004f6632:
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._21_3_ = 0;
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0x10] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0x11] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0x12] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0x13] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[7] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[5] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[6] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[4] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content._0_4_ = *(uint *)((long)&this_04->_value + 1);
            uVar6 = *(undefined8 *)((long)&this_04->_value + 9);
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[8] = (char)uVar6;
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content._9_6_ = SUB86((ulong)uVar6 >> 8,0);
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0xf] = (char)((ulong)uVar6 >> 0x38);
          }
          else {
LAB_004f667d:
            pMVar27 = &this_04->_value;
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._21_3_ = 0;
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0x10] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0x11] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0x12] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0x13] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0xf] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[9] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[10] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0xb] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0xc] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0xd] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0xe] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[8] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[7] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[5] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[6] = '\0';
            local_1e8.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[4] = '\0';
            if (local_1e8.super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._0_1_ == 1) {
              local_1e8.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content._0_4_ = *(uint *)((long)pMVar27 + 1);
            }
            else {
              local_1e8.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[5] = '\0';
              local_1e8.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[6] = '\0';
              local_1e8.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[7] = '\0';
              local_1e8.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[8] = '\0';
              uVar6 = *(undefined8 *)((long)pMVar27 + 10);
              local_1e8.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content._0_4_ = *(uint *)((long)pMVar27 + 1) & 0xffffff03;
              local_1e8.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[4] = (char)((uint)*(undefined4 *)((long)pMVar27 + 2) >> 0x18);
              local_1e8.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content._9_6_ = SUB86(uVar6,0);
              local_1e8.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[0xf] = (char)((ulong)uVar6 >> 0x30);
              local_1e8.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content[0x10] = (char)((ulong)uVar6 >> 0x38);
              local_1e8.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content._17_3_ = 0;
            }
          }
        }
        else {
          if (uVar25 != 1) {
            local_1d0._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0] = local_88.super_PolyNfSuper._inner.
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           .
                           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                           ._content[0] & 3;
            local_1d0._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[8] = '\0';
            local_1d0._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content._5_3_ = 0;
            local_1d0._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[4] = local_88.super_PolyNfSuper._inner.
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           .
                           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                           ._content[4];
            local_1d0._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0x10] =
                 local_88.super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._content[0x10];
            goto LAB_004f646e;
          }
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content._1_2_ = uVar10;
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[3] = cVar11;
          local_1d0._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content._11_5_ = uVar12;
          Lib::
          BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/PolynomialEvaluation.cpp:224:9),_Lib::ReturnNone<Kernel::PolyNf>,_MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>_&,_std::tuple<>_>
          ::apply::anon_class_24_3_9e03d13b::operator()(&local_1e8,&local_a0);
        }
        SVar14._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>,_true,_true>
                )local_138._self;
        if ((local_218.super_PolyNfSuper._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._0_1_ & 3) != 1) {
          uVar25 = uStack_1fb;
          if ((local_218.super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._0_1_ & 3) == 0) {
            uVar25 = Kernel::FuncTerm::numTermArguments
                               ((FuncTerm *)
                                CONCAT17(local_218.super_PolyNfSuper._inner.
                                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                         .
                                         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                         ._content[0xf],
                                         CONCAT25(local_218.super_PolyNfSuper._inner.
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                                  .
                                                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                                  ._content._13_2_,
                                                  CONCAT14(local_218.super_PolyNfSuper._inner.
                                                                                                                      
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                                  .
                                                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                                  ._content[0xc],
                                                  local_218.super_PolyNfSuper._inner.
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                                  .
                                                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                                  ._content._8_4_))));
          }
          if (uVar25 != 0) {
            *(PolyNf **)
             ((long)SVar14._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl + 0x10)
                 = *(PolyNf **)
                    ((long)SVar14._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl
                    + 0x10) + (-1 - (ulong)(uVar25 - 1));
          }
        }
        SVar14._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>,_true,_true>
                )local_138._self;
        local_224 = '\0';
        local_190 = '\0';
        local_198 = '\0';
        uStack_197 = 0;
        bVar24 = local_1e8.super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._0_1_ & 3;
        uVar25 = local_1e8.super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._content._0_4_;
        if (bVar24 == 0) {
          local_228._0_1_ =
               local_1e8.super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content[0];
          local_228._1_1_ =
               local_1e8.super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content[1];
          local_228._2_1_ =
               local_1e8.super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content[2];
          local_228._3_1_ =
               local_1e8.super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content[3];
          local_198 = local_1e8.super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      ._content[8];
          uStack_197 = (undefined7)
                       (CONCAT17(local_1e8.super_PolyNfSuper._inner.
                                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                 .
                                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                 ._content[0xf],
                                 CONCAT61(local_1e8.super_PolyNfSuper._inner.
                                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                          .
                                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                          ._content._9_6_,
                                          local_1e8.super_PolyNfSuper._inner.
                                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                          .
                                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                          ._content[8])) >> 8);
        }
        else if (bVar24 == 1) {
          local_228._0_1_ =
               local_1e8.super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content[0];
          local_228._1_1_ =
               local_1e8.super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content[1];
          local_228._2_1_ =
               local_1e8.super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content[2];
          local_228._3_1_ =
               local_1e8.super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content[3];
        }
        else {
          uStack_197 = CONCAT16(local_1e8.super_PolyNfSuper._inner.
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                .
                                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                ._content[0xf],
                                local_1e8.super_PolyNfSuper._inner.
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                .
                                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                ._content._9_6_);
          local_228 = local_1e8.super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      ._content._0_4_ & 0xffffff03;
          local_224 = local_1e8.super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      ._content[4];
          local_190 = local_1e8.super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      ._content[0x10];
          uVar25 = (uint)(local_1e8.super_PolyNfSuper._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          .
                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                          ._content[0] & 3);
        }
        pPVar21 = *(PolyNf **)
                   ((long)local_138._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl +
                   0x10);
        if (pPVar21 ==
            *(PolyNf **)
             ((long)local_138._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl + 0x18)
           ) {
          Lib::Stack<Kernel::PolyNf>::expand
                    ((Stack<Kernel::PolyNf> *)
                     local_138._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl);
          pPVar21 = *(PolyNf **)
                     ((long)SVar14._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl
                     + 0x10);
        }
        *(undefined8 *)
         &(pPVar21->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = 0;
        pDVar9 = &(pPVar21->super_PolyNfSuper)._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        ;
        (pDVar9->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[7] = '\0';
        (pDVar9->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[8] = '\0';
        (pDVar9->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[9] = '\0';
        (pDVar9->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[10] = '\0';
        (pDVar9->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[0xb] = '\0';
        (pDVar9->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[0xc] = '\0';
        (pDVar9->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[0xd] = '\0';
        (pDVar9->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[0xe] = '\0';
        *(undefined8 *)
         ((pPVar21->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content + 0xf) = 0;
        *(byte *)&(pPVar21->super_PolyNfSuper)._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = bVar24;
        if (bVar24 == 0) {
          *(uint *)(pPVar21->super_PolyNfSuper)._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ._content = local_228;
          *(ulong *)((pPVar21->super_PolyNfSuper)._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     ._content + 8) = CONCAT71(uStack_197,local_198);
        }
        else if (bVar24 == 1) {
          *(uint *)(pPVar21->super_PolyNfSuper)._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ._content = local_228;
        }
        else {
          pDVar9 = &(pPVar21->super_PolyNfSuper)._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          ;
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[4] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[5] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[6] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[7] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[8] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[9] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[10] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xb] = '\0';
          pDVar9 = &(pPVar21->super_PolyNfSuper)._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          ;
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xc] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xd] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xe] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xf] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0x10] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0x11] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0x12] = '\0';
          (pDVar9->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0x13] = '\0';
          (pPVar21->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0] = (byte)uVar25 & 3;
          *(uint *)((pPVar21->super_PolyNfSuper)._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._content + 1) = CONCAT13(local_224,local_228._1_3_);
          *(ulong *)((pPVar21->super_PolyNfSuper)._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     ._content + 9) = CONCAT17(local_190,uStack_197);
        }
        ppPVar2 = (PolyNf **)
                  ((long)SVar14._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                         .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl +
                  0x10);
        *ppPVar2 = *ppPVar2 + 1;
      }
      pBVar19 = *(BottomUpChildIter<Kernel::PolyNf> **)
                 ((long)local_148._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                        ._M_head_impl + 0x10);
    } while (pBVar19 !=
             *(BottomUpChildIter<Kernel::PolyNf> **)
              ((long)local_148._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                     ._M_head_impl + 8));
  }
  this_01 = local_e8;
  pPVar5 = local_f0;
  pPVar21 = *(PolyNf **)
             ((long)local_138._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl + 0x10)
  ;
  *(PolyNf **)
   ((long)local_138._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl + 0x10) =
       pPVar21 + -1;
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[4] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[8] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[9] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[10] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0xb] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0xc] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0xd] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0xe] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0xf] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0x10] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0x11] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0x12] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0x13] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._21_1_ = 0;
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._22_2_ = 0;
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._0_1_ = *(byte *)&pPVar21[-1].super_PolyNfSuper._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           & 3;
  if ((anon_class_1_0_00000001)
      local_218.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._0_1_ == (anon_class_1_0_00000001)0x0) {
    uVar4 = *(undefined4 *)
             pPVar21[-1].super_PolyNfSuper._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._content;
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0] = (char)uVar4;
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content._1_2_ = SUB42((uint)uVar4 >> 8,0);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[3] = (char)((uint)uVar4 >> 0x18);
    uVar6 = *(undefined8 *)
             (pPVar21[-1].super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content + 8);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content._8_4_ = SUB84(uVar6,0);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xc] = (char)((ulong)uVar6 >> 0x20);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content._13_2_ = SUB82((ulong)uVar6 >> 0x28,0);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xf] = (char)((ulong)uVar6 >> 0x38);
  }
  else if ((anon_class_1_0_00000001)
           local_218.super_PolyNfSuper._inner.
           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
           .
           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           ._0_1_ == (anon_class_1_0_00000001)0x1) {
    uVar4 = *(undefined4 *)
             pPVar21[-1].super_PolyNfSuper._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._content;
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0] = (char)uVar4;
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content._1_2_ = SUB42((uint)uVar4 >> 8,0);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[3] = (char)((uint)uVar4 >> 0x18);
  }
  else {
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0] = pPVar21[-1].super_PolyNfSuper._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ._content[0] & 3;
    uVar6 = *(undefined8 *)
             (pPVar21[-1].super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content + 9);
    uVar4 = *(undefined4 *)
             (pPVar21[-1].super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content + 1);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content._1_2_ = SUB42(uVar4,0);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[3] = (char)((uint)uVar4 >> 0x10);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[4] = (char)((uint)uVar4 >> 0x18);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content._9_3_ = SUB83(uVar6,0);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content._8_4_ =
         (uint)(uint3)local_218.super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      ._content._9_3_ << 8;
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xc] = (char)((ulong)uVar6 >> 0x18);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content._13_2_ = SUB82((ulong)uVar6 >> 0x20,0);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xf] = (char)((ulong)uVar6 >> 0x30);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0x10] = (char)((ulong)uVar6 >> 0x38);
    local_218.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content._17_3_ = 0;
  }
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[7] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[5] = '\0';
  local_218.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[6] = '\0';
  Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
            (&local_138);
  Lib::
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_148);
  bVar16 = Kernel::operator!=(&local_218,pPVar5);
  if (bVar16) {
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[4] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[8] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[9] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[10] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0xb] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0xc] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0xd] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0xe] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0xf] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x10] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x11] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x12] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x13] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x14] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x15] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[0x16] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._0_1_ = local_218.super_PolyNfSuper._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._0_1_ & 3;
    if (local_178._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
        .
        super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
        ._0_1_ == 0) {
      local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content._0_4_ =
           CONCAT13(local_218.super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._content[3],
                    CONCAT21(local_218.super_PolyNfSuper._inner.
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                             .
                             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                             ._content._1_2_,
                             local_218.super_PolyNfSuper._inner.
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                             .
                             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                             ._content[0]));
      local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content[8] = local_218.super_PolyNfSuper._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     ._content[8];
      local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content[9] = local_218.super_PolyNfSuper._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     ._content[9];
      local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content[10] =
           local_218.super_PolyNfSuper._inner.
           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
           .
           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           ._content[10];
      local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content[0xb] =
           local_218.super_PolyNfSuper._inner.
           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
           .
           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           ._content[0xb];
      local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content._12_4_ =
           SUB84(CONCAT17(local_218.super_PolyNfSuper._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          .
                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                          ._content[0xf],
                          CONCAT25(local_218.super_PolyNfSuper._inner.
                                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                   .
                                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                   ._content._13_2_,
                                   CONCAT14(local_218.super_PolyNfSuper._inner.
                                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                            .
                                            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                            ._content[0xc],
                                            local_218.super_PolyNfSuper._inner.
                                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                            .
                                            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                            ._content._8_4_))) >> 0x20,0);
    }
    else if (local_178._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
             .
             super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
             ._0_1_ == 1) {
      local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content._0_4_ =
           CONCAT13(local_218.super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._content[3],
                    CONCAT21(local_218.super_PolyNfSuper._inner.
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                             .
                             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                             ._content._1_2_,
                             local_218.super_PolyNfSuper._inner.
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                             .
                             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                             ._content[0]));
    }
    else {
      local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content._0_4_ =
           CONCAT31(CONCAT12(local_218.super_PolyNfSuper._inner.
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                             .
                             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                             ._content[3],
                             local_218.super_PolyNfSuper._inner.
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                             .
                             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                             ._content._1_2_),
                    local_218.super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._content[0]) & 0xffffff03;
      local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content[4] = local_218.super_PolyNfSuper._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     ._content[4];
      local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content._8_4_ =
           (uint)(uint3)local_218.super_PolyNfSuper._inner.
                        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                        .
                        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                        ._content._9_3_ << 8;
      local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content._12_4_ =
           SUB74(CONCAT16(local_218.super_PolyNfSuper._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          .
                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                          ._content[0xf],
                          CONCAT24(local_218.super_PolyNfSuper._inner.
                                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                   .
                                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                   ._content._13_2_,
                                   CONCAT13(local_218.super_PolyNfSuper._inner.
                                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                            .
                                            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                            ._content[0xc],
                                            local_218.super_PolyNfSuper._inner.
                                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                            .
                                            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                            ._content._9_3_))) >> 0x18,0);
      local_178._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content._16_4_ =
           local_218.super_PolyNfSuper._inner.
           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
           .
           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           ._content._16_4_ & 0xff;
    }
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[7] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[5] = '\0';
    local_178._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
    .
    super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ._content[6] = '\0';
    Lib::OptionBase<Kernel::PolyNf>::OptionBase(this_01,(PolyNf *)&local_178);
  }
  else {
    *(undefined8 *)((long)&(this_01->_elem)._elem + 8) = 0;
    *(undefined8 *)((long)&(this_01->_elem)._elem + 0x10) = 0;
    *(undefined8 *)this_01 = 0;
    *(undefined8 *)((long)&(this_01->_elem)._elem + 4) = 0;
  }
  return (Option<Kernel::PolyNf> *)this_01;
}

Assistant:

Option<PolyNf> PolynomialEvaluation::evaluate(PolyNf normalized) const 
{
  static MemoNonVars<PolyNf, PolyNf> memo;
  auto out = BottomUpEvaluation<PolyNf, PolyNf>()
    .function(
        [&](PolyNf orig, PolyNf* ts) -> PolyNf 
        { 
          return orig.match(
              [&](Perfect<FuncTerm> f)
              { 
                return f->function().tryInterpret()
                  .andThen( [&](Theory::Interpretation && i)  -> Option<PolyNf>
                    { return trySimplify(i, ts); })
                  .unwrapOrElse([&]() -> PolyNf
                    { return PolyNf(perfect(FuncTerm(f->function(), ts))); });

              }, 

              [&](Variable v) 
              { return PolyNf(v); },

              [&](AnyPoly p) 
              { return PolyNf(simplifyPoly(p, ts, /*removeZeros=*/true)); }
          );
        })
    .memo<decltype(memo)&>(memo)
    .apply(normalized);
  auto outOpt = someIf(out != normalized, [&]() { return out; });
  DEBUG("evaluated ", normalized, " ==> ", outOpt)
  return outOpt;
}